

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildReturn(CNscPStackEntry *pReturn)

{
  bool bVar1;
  NscType NVar2;
  CNscPStackEntry *in_RDI;
  NscSymbol *pSymbol;
  NscSymbolFence *pFence;
  NscType nType;
  size_t nDataSize;
  uchar *pauchData;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffb8;
  NscType in_stack_ffffffffffffffbc;
  CNscContext *in_stack_ffffffffffffffc0;
  NscSymbolFence *local_38;
  NscType local_2c;
  size_t nDataSize_00;
  uchar *pauchData_00;
  CNscPStackEntry *local_8;
  
  local_8 = CNscContext::GetPStackEntry
                      (in_stack_ffffffffffffffc0,
                       (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    if ((in_RDI == (CNscPStackEntry *)0x0) ||
       (NVar2 = CNscPStackEntry::GetType(in_RDI), NVar2 != NscType_Error)) {
      pauchData_00 = (uchar *)0x0;
      nDataSize_00 = 0;
      if (in_RDI != (CNscPStackEntry *)0x0) {
        pauchData_00 = CNscPStackEntry::GetData(in_RDI);
        nDataSize_00 = CNscPStackEntry::GetDataSize(in_RDI);
      }
      if (nDataSize_00 == 0) {
        local_2c = NscType_Unknown;
      }
      else {
        local_2c = CNscPStackEntry::GetType(in_RDI);
      }
      local_38 = CNscContext::GetCurrentFence(g_pCtx);
      NVar2 = in_stack_ffffffffffffffbc;
      while( true ) {
        in_stack_ffffffffffffffbc = NVar2 & 0xffffff;
        if (local_38 != (NscSymbolFence *)0x0) {
          in_stack_ffffffffffffffbc = CONCAT13(local_38->nFnSymbol == 0,(int3)NVar2);
        }
        if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
        local_38 = local_38->pNext;
        NVar2 = in_stack_ffffffffffffffbc;
      }
      if (local_38 == (NscSymbolFence *)0x0) {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorReturnOutsideFunction);
      }
      else {
        in_stack_ffffffffffffffc0 =
             (CNscContext *)
             CNscContext::GetSymbol
                       (in_stack_ffffffffffffffc0,
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (((((anon_union_40_3_e2189aaa_for_NscSymbol_6 *)&in_stack_ffffffffffffffc0->m_pStreamTop)
             ->field_0).nToken == 1) || (local_2c != NscType_Unknown)) {
          if (((((anon_union_40_3_e2189aaa_for_NscSymbol_6 *)
                &in_stack_ffffffffffffffc0->m_pStreamTop)->field_0).nToken == 1) &&
             (local_2c != NscType_Unknown)) {
            CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorReturnValueIllegalOnVoidFn);
          }
          else if (((((anon_union_40_3_e2189aaa_for_NscSymbol_6 *)
                     &in_stack_ffffffffffffffc0->m_pStreamTop)->field_0).nToken != 1) &&
                  (local_2c !=
                   (((anon_union_40_3_e2189aaa_for_NscSymbol_6 *)
                    &in_stack_ffffffffffffffc0->m_pStreamTop)->field_0).nToken)) {
            CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorTypeMismatchOnReturn);
          }
        }
        else {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorReturnValueExpected);
        }
      }
      CNscPStackEntry::PushReturn
                (in_RDI,(NscType)((ulong)local_8 >> 0x20),pauchData_00,nDataSize_00);
      bVar1 = CNscContext::GetOptReturn(g_pCtx);
      if (bVar1) {
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
      else {
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
      NscSetFenceReturn(SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
    }
    else {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    if (in_RDI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffffc0,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
  }
  else {
    if (in_RDI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffffc0,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
    ;
  }
  return local_8;
}

Assistant:

YYSTYPE NscBuildReturn (YYSTYPE pReturn)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pReturn)
			g_pCtx ->FreePStackEntry (pReturn);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}

	//
	// Check for silent errors
	//

	if (pReturn != NULL && pReturn ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, normal processing
	//

	else
	{

		//
		// Get the data
		//

		unsigned char *pauchData = NULL;
		size_t nDataSize = 0;
		if (pReturn)
		{
			pauchData = pReturn ->GetData ();
			nDataSize = pReturn ->GetDataSize ();
		} 

		//
		// Get the return type
		//

		NscType nType;
		if (nDataSize > 0)
			nType = pReturn ->GetType ();
		else
			nType = NscType_Unknown;

		//
		// Get the return type of the function
		//

		NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
		while (pFence && pFence ->nFnSymbol == 0)
			pFence = pFence ->pNext;
		if (pFence)
		{
			NscSymbol *pSymbol = g_pCtx ->GetSymbol (pFence ->nFnSymbol);
			if (pSymbol ->nType != NscType_Void && nType == NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorReturnValueExpected);
			}
			else if (pSymbol ->nType == NscType_Void && nType != NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorReturnValueIllegalOnVoidFn);
			}
			else if (pSymbol ->nType != NscType_Void && nType != pSymbol ->nType)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorTypeMismatchOnReturn);
			}
		}
		else
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorReturnOutsideFunction);
		}

		//
		// Push the return
		//

		pOut ->PushReturn (nType, pauchData, nDataSize);
		if (g_pCtx ->GetOptReturn ())
        	pOut ->SetType (NscType_Unknown);
		else
        	pOut ->SetType (nType);

		//
		// Set the fence
		//

		NscSetFenceReturn (true);
	}

	//
	// Return results
	//

	if (pReturn)
        g_pCtx ->FreePStackEntry (pReturn);
	return pOut;
}